

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O0

void __thiscall
asio::detail::op_queue<asio::detail::scheduler_operation>::push<asio::detail::scheduler_operation>
          (op_queue<asio::detail::scheduler_operation> *this,
          op_queue<asio::detail::scheduler_operation> *q)

{
  scheduler_operation *o2;
  scheduler_operation **ppsVar1;
  scheduler_operation *other_front;
  op_queue<asio::detail::scheduler_operation> *q_local;
  op_queue<asio::detail::scheduler_operation> *this_local;
  
  ppsVar1 = op_queue_access::front<asio::detail::scheduler_operation>(q);
  o2 = *ppsVar1;
  if (o2 != (scheduler_operation *)0x0) {
    if (this->back_ == (scheduler_operation *)0x0) {
      this->front_ = o2;
    }
    else {
      op_queue_access::next<asio::detail::scheduler_operation,asio::detail::scheduler_operation>
                (&this->back_,o2);
    }
    ppsVar1 = op_queue_access::back<asio::detail::scheduler_operation>(q);
    this->back_ = *ppsVar1;
    ppsVar1 = op_queue_access::front<asio::detail::scheduler_operation>(q);
    *ppsVar1 = (scheduler_operation *)0x0;
    ppsVar1 = op_queue_access::back<asio::detail::scheduler_operation>(q);
    *ppsVar1 = (scheduler_operation *)0x0;
  }
  return;
}

Assistant:

void push(op_queue<OtherOperation>& q)
  {
    if (Operation* other_front = op_queue_access::front(q))
    {
      if (back_)
        op_queue_access::next(back_, other_front);
      else
        front_ = other_front;
      back_ = op_queue_access::back(q);
      op_queue_access::front(q) = 0;
      op_queue_access::back(q) = 0;
    }
  }